

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_short>,unsigned_short,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ushort uVar1;
  unsigned_long *puVar2;
  ushort *puVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  unsigned_long uVar11;
  idx_t iVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar7 = 0;
      uVar8 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = puVar2[uVar7];
        }
        uVar13 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar13 = count;
        }
        uVar9 = uVar13;
        if (uVar11 != 0) {
          uVar9 = uVar8;
          if (uVar11 == 0xffffffffffffffff) {
            if (uVar8 < uVar13) {
              bVar6 = *state;
              do {
                uVar1 = *(ushort *)(pdVar4 + uVar9 * 2);
                if ((bVar6 & 1) == 0) {
                  *(ushort *)(state + 2) = uVar1;
                  *state = '\x01';
                  bVar6 = 1;
                }
                else {
                  *(ushort *)(state + 2) = *(ushort *)(state + 2) ^ uVar1;
                }
                uVar9 = uVar9 + 1;
              } while (uVar13 != uVar9);
            }
          }
          else if (uVar8 < uVar13) {
            uVar9 = 0;
            do {
              if ((uVar11 >> (uVar9 & 0x3f) & 1) != 0) {
                uVar1 = *(ushort *)(pdVar4 + uVar9 * 2 + uVar8 * 2);
                if (*state == '\0') {
                  *(ushort *)(state + 2) = uVar1;
                  *state = '\x01';
                }
                else {
                  *(ushort *)(state + 2) = *(ushort *)(state + 2) ^ uVar1;
                }
              }
              uVar9 = uVar9 + 1;
            } while ((uVar8 - uVar13) + uVar9 != 0);
            uVar9 = uVar8 + uVar9;
          }
        }
        uVar7 = uVar7 + 1;
        uVar8 = uVar9;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) && (count != 0)) {
      puVar3 = (ushort *)input->data;
      bVar6 = *state;
      do {
        if ((bVar6 & 1) == 0) {
          *(ushort *)(state + 2) = *puVar3;
          *state = '\x01';
          bVar6 = 1;
        }
        else {
          *(ushort *)(state + 2) = *(ushort *)(state + 2) ^ *puVar3;
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_68.sel)->sel_vector;
        bVar6 = *state;
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (psVar5 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar5[iVar10];
          }
          if ((bVar6 & 1) == 0) {
            *(ushort *)(state + 2) = *(ushort *)(local_68.data + iVar12 * 2);
            *state = '\x01';
            bVar6 = 1;
          }
          else {
            *(ushort *)(state + 2) =
                 *(ushort *)(state + 2) ^ *(ushort *)(local_68.data + iVar12 * 2);
          }
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
      }
    }
    else if (count != 0) {
      psVar5 = (local_68.sel)->sel_vector;
      iVar10 = 0;
      do {
        iVar12 = iVar10;
        if (psVar5 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar5[iVar10];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6]
             >> (iVar12 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            *(ushort *)(state + 2) = *(ushort *)(local_68.data + iVar12 * 2);
            *state = '\x01';
          }
          else {
            *(ushort *)(state + 2) =
                 *(ushort *)(state + 2) ^ *(ushort *)(local_68.data + iVar12 * 2);
          }
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}